

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder.c
# Opt level: O0

lzma_ret block_encoder_init(lzma_stream_coder_conflict *coder,lzma_allocator *allocator)

{
  lzma_ret ret_;
  lzma_allocator *allocator_local;
  lzma_stream_coder_conflict *coder_local;
  
  (coder->block_options).compressed_size = 0xffffffffffffffff;
  (coder->block_options).uncompressed_size = 0xffffffffffffffff;
  coder_local._4_4_ = lzma_block_header_size(&coder->block_options);
  if (coder_local._4_4_ == LZMA_OK) {
    coder_local._4_4_ =
         lzma_block_encoder_init(&coder->block_encoder,allocator,&coder->block_options);
  }
  return coder_local._4_4_;
}

Assistant:

static lzma_ret
block_encoder_init(lzma_stream_coder *coder, const lzma_allocator *allocator)
{
	// Prepare the Block options. Even though Block encoder doesn't need
	// compressed_size, uncompressed_size, and header_size to be
	// initialized, it is a good idea to do it here, because this way
	// we catch if someone gave us Filter ID that cannot be used in
	// Blocks/Streams.
	coder->block_options.compressed_size = LZMA_VLI_UNKNOWN;
	coder->block_options.uncompressed_size = LZMA_VLI_UNKNOWN;

	return_if_error(lzma_block_header_size(&coder->block_options));

	// Initialize the actual Block encoder.
	return lzma_block_encoder_init(&coder->block_encoder, allocator,
			&coder->block_options);
}